

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

string * vera::toUpper(string *__return_storage_ptr__,string *_string)

{
  int iVar1;
  char *pcVar2;
  undefined1 *puVar3;
  int i;
  string *_string_local;
  string *std;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)_string);
  while (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)_string), *pcVar2 != '\0') {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)_string);
    iVar1 = toupper((int)*pcVar2);
    puVar3 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *puVar3 = (char)iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toUpper(const std::string& _string) {
    std::string std = _string;
    for (int i = 0; _string[i]; i++) {
        std[i] = toupper(_string[i]);
    }
    return std;
}